

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMathematics.cpp
# Opt level: O3

double chrono::ChNoise(double x,double amp,double freq,int octaves,double amp_ratio)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  undefined8 in_XMM0_Qb;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  
  uVar4 = CH_PAseed;
  if (octaves < 1) {
    dVar10 = 0.0;
  }
  else {
    dVar10 = 0.0;
    do {
      dVar14 = 1.0 / freq;
      auVar12._0_8_ = x / dVar14;
      auVar12._8_8_ = in_XMM0_Qb;
      auVar12 = vroundsd_avx(auVar12,auVar12,9);
      iVar9 = (int)auVar12._0_8_;
      dVar11 = dVar14 * auVar12._0_8_;
      lVar8 = (long)(int)(iVar9 + 0x3039U ^ 0x75bd924);
      if (CH_PAseed == 0) {
        lVar8 = 0x75bd924;
      }
      lVar5 = (lVar8 / 0x1f31d) * -0x7fffffff + lVar8 * 0x41a7;
      lVar8 = lVar5 + 0x7fffffff;
      if (-1 < lVar5) {
        lVar8 = lVar5;
      }
      lVar5 = (lVar8 / 0x1f31d) * -0x7fffffff + lVar8 * 0x41a7;
      lVar8 = lVar5 + 0x7fffffff;
      if (-1 < lVar5) {
        lVar8 = lVar5;
      }
      lVar5 = (lVar8 / 0x1f31d) * -0x7fffffff + lVar8 * 0x41a7;
      lVar8 = lVar5 + 0x7fffffff;
      if (-1 < lVar5) {
        lVar8 = lVar5;
      }
      lVar5 = (lVar8 / 0x1f31d) * -0x7fffffff + lVar8 * 0x41a7;
      lVar8 = lVar5 + 0x7fffffff;
      if (-1 < lVar5) {
        lVar8 = lVar5;
      }
      lVar5 = (long)(int)(iVar9 + 0x303aU ^ 0x75bd924);
      if (lVar8 == 0x75bd924) {
        lVar5 = 0x75bd924;
      }
      lVar5 = (lVar5 / 0x1f31d) * -0x7fffffff + lVar5 * 0x41a7;
      dVar3 = amp * ((double)lVar8 * 4.656612875245797e-10 + -0.5);
      lVar8 = lVar5 + 0x7fffffff;
      if (-1 < lVar5) {
        lVar8 = lVar5;
      }
      lVar5 = (lVar8 / 0x1f31d) * -0x7fffffff + lVar8 * 0x41a7;
      lVar8 = lVar5 + 0x7fffffff;
      if (-1 < lVar5) {
        lVar8 = lVar5;
      }
      lVar5 = (lVar8 / 0x1f31d) * -0x7fffffff + lVar8 * 0x41a7;
      lVar8 = lVar5 + 0x7fffffff;
      if (-1 < lVar5) {
        lVar8 = lVar5;
      }
      uVar6 = (lVar8 / 0x1f31d) * -0x7fffffff + lVar8 * 0x41a7;
      uVar7 = uVar6 + 0x7fffffff;
      if (-1 < (long)uVar6) {
        uVar7 = uVar6;
      }
      CH_PAseed = uVar7 ^ 0x75bd924;
      dVar11 = (x - dVar11) / ((dVar14 + dVar11) - dVar11);
      dVar14 = pow(dVar11,3.0);
      in_XMM0_Qb = 0;
      octaves = octaves + -1;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = dVar11 * dVar11;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = dVar14 * -2.0;
      auVar12 = vfmadd231sd_fma(auVar13,ZEXT816(0x4008000000000000),auVar1);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar3;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = amp * ((double)(long)uVar7 * 4.656612875245797e-10 + -0.5) - dVar3;
      auVar12 = vfmadd132sd_fma(auVar12,auVar15,auVar2);
      amp = amp * amp_ratio;
      freq = freq + freq;
      dVar10 = dVar10 + auVar12._0_8_;
    } while (octaves != 0);
  }
  CH_PAseed = uVar4;
  return dVar10;
}

Assistant:

double ChNoise(double x, double amp, double freq, int octaves, double amp_ratio) {
    double ret = 0;
    long oldseed = CH_PAseed;
    double o_freq, o_amp, xA, xB, yA, yB, period;
    int iA, iB;

    o_freq = freq;
    o_amp = amp;

    for (int i = 1; i <= octaves; i++) {
        period = 1.0 / o_freq;
        xA = period * floor(x / period);
        xB = xA + period;
        iA = int(floor(x / period));
        iB = iA + 1;
        ChSetRandomSeed((long)(iA + 12345));
        ChRandom();
        ChRandom();
        ChRandom();  // just to puzzle the seed..
        yA = (ChRandom() - 0.5) * o_amp;
        ChSetRandomSeed((long)(iB + 12345));
        ChRandom();
        ChRandom();
        ChRandom();  // just to puzzle the seed..
        yB = (ChRandom() - 0.5) * o_amp;
        // cubic noise interpolation from (xA,yA) to (xB,yB), with flat extremal derivatives
        ret += yA + (yB - yA) * ((3 * (pow(((x - xA) / (xB - xA)), 2))) - 2 * (pow(((x - xA) / (xB - xA)), 3)));
        // for following octave, reduce amplitude...
        o_amp *= amp_ratio;
        o_freq *= 2.0;
    }
    // restore previous seed
    CH_PAseed = oldseed;
    return ret;
}